

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

void __thiscall QCborContainerPrivate::removeAt(QCborContainerPrivate *this,qsizetype idx)

{
  long in_FS_OFFSET;
  QCborValue local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.n = 0;
  local_38.container = (QCborContainerPrivate *)0x0;
  local_38.t = Undefined;
  replaceAt(this,idx,&local_38,CopyContainer);
  QCborValue::~QCborValue((QCborValue *)&local_38);
  QList<QtCbor::Element>::remove(&this->elements,(char *)idx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void removeAt(qsizetype idx)
    {
        replaceAt(idx, {});
        elements.remove(idx);
    }